

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

bool __thiscall google::protobuf::io::CodedInputStream::Refresh(CodedInputStream *this)

{
  ZeroCopyInputStream *pZVar1;
  uint8_t *puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  string *extraout_RAX;
  int iVar6;
  int extraout_EDX;
  char cVar7;
  long lVar8;
  CodedInputStream *this_00;
  int iVar9;
  string *psVar10;
  size_t __n;
  int buffer_size;
  void *void_buffer;
  uint local_44;
  uint8_t *local_40;
  
  iVar4 = (int)this->buffer_end_ - (int)this->buffer_;
  if (iVar4 == 0) {
    psVar10 = (string *)0x0;
  }
  else {
    psVar10 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                        (0,(long)iVar4,"0 == BufferSize()");
  }
  if (psVar10 != (string *)0x0) {
    Refresh();
    psVar10 = extraout_RAX;
LAB_002ab5d1:
    this_00 = (CodedInputStream *)&stack0xffffffffffffffc8;
    Refresh();
    iVar4 = extraout_EDX;
    do {
      iVar6 = iVar4;
      puVar2 = this_00->buffer_;
      iVar9 = (int)this_00->buffer_end_ - (int)puVar2;
      if (iVar6 - iVar9 == 0 || iVar6 < iVar9) {
        memcpy(psVar10,puVar2,(long)iVar6);
        this_00->buffer_ = this_00->buffer_ + iVar6;
        break;
      }
      __n = (size_t)iVar9;
      memcpy(psVar10,puVar2,__n);
      psVar10 = psVar10 + __n;
      this_00->buffer_ = this_00->buffer_ + __n;
      bVar3 = Refresh(this_00);
      iVar4 = iVar6 - iVar9;
    } while (bVar3);
    return iVar6 <= iVar9;
  }
  if (((this->buffer_size_after_limit_ < 1) && (this->overflow_bytes_ < 1)) &&
     (this->total_bytes_read_ != this->current_limit_)) {
    pZVar1 = this->input_;
    do {
      iVar4 = (*pZVar1->_vptr_ZeroCopyInputStream[2])(pZVar1,&local_40,&local_44);
      cVar7 = (char)iVar4;
      if (cVar7 == '\0') break;
    } while (local_44 == 0);
    if (cVar7 == '\0') {
      this->buffer_ = (uint8_t *)0x0;
      this->buffer_end_ = (uint8_t *)0x0;
    }
    else {
      this->buffer_ = local_40;
      lVar8 = (long)(int)local_44;
      this->buffer_end_ = local_40 + lVar8;
      if (lVar8 < 0) {
        psVar10 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                            (lVar8,0,"buffer_size >= 0");
      }
      else {
        psVar10 = (string *)0x0;
      }
      if (psVar10 != (string *)0x0) goto LAB_002ab5d1;
      iVar4 = this->total_bytes_read_;
      iVar6 = iVar4 - (local_44 ^ 0x7fffffff);
      if (iVar6 == 0 || iVar4 < (int)(local_44 ^ 0x7fffffff)) {
        iVar4 = local_44 + iVar4;
      }
      else {
        this->overflow_bytes_ = iVar6;
        this->buffer_end_ = this->buffer_end_ + -(long)iVar6;
        iVar4 = 0x7fffffff;
      }
      this->total_bytes_read_ = iVar4;
      iVar6 = this->buffer_size_after_limit_;
      puVar2 = this->buffer_end_;
      this->buffer_end_ = puVar2 + iVar6;
      iVar9 = this->current_limit_;
      if (this->total_bytes_limit_ < this->current_limit_) {
        iVar9 = this->total_bytes_limit_;
      }
      iVar5 = iVar4 - iVar9;
      if (iVar5 == 0 || iVar4 < iVar9) {
        this->buffer_size_after_limit_ = 0;
      }
      else {
        this->buffer_size_after_limit_ = iVar5;
        this->buffer_end_ = puVar2 + iVar6 + -(long)iVar5;
      }
    }
  }
  else {
    cVar7 = '\0';
    if ((this->total_bytes_limit_ <= this->total_bytes_read_ - this->buffer_size_after_limit_) &&
       (this->total_bytes_limit_ != this->current_limit_)) {
      PrintTotalBytesLimitError(this);
      cVar7 = '\0';
    }
  }
  return (bool)cVar7;
}

Assistant:

bool CodedInputStream::Refresh() {
  ABSL_DCHECK_EQ(0, BufferSize());

  if (buffer_size_after_limit_ > 0 || overflow_bytes_ > 0 ||
      total_bytes_read_ == current_limit_) {
    // We've hit a limit.  Stop.
    int current_position = total_bytes_read_ - buffer_size_after_limit_;

    if (current_position >= total_bytes_limit_ &&
        total_bytes_limit_ != current_limit_) {
      // Hit total_bytes_limit_.
      PrintTotalBytesLimitError();
    }

    return false;
  }

  const void* void_buffer;
  int buffer_size;
  if (NextNonEmpty(input_, &void_buffer, &buffer_size)) {
    buffer_ = reinterpret_cast<const uint8_t*>(void_buffer);
    buffer_end_ = buffer_ + buffer_size;
    ABSL_CHECK_GE(buffer_size, 0);

    if (total_bytes_read_ <= INT_MAX - buffer_size) {
      total_bytes_read_ += buffer_size;
    } else {
      // Overflow.  Reset buffer_end_ to not include the bytes beyond INT_MAX.
      // We can't get that far anyway, because total_bytes_limit_ is guaranteed
      // to be less than it.  We need to keep track of the number of bytes
      // we discarded, though, so that we can call input_->BackUp() to back
      // up over them on destruction.

      // The following line is equivalent to:
      //   overflow_bytes_ = total_bytes_read_ + buffer_size - INT_MAX;
      // except that it avoids overflows.  Signed integer overflow has
      // undefined results according to the C standard.
      overflow_bytes_ = total_bytes_read_ - (INT_MAX - buffer_size);
      buffer_end_ -= overflow_bytes_;
      total_bytes_read_ = INT_MAX;
    }

    RecomputeBufferLimits();
    return true;
  } else {
    buffer_ = NULL;
    buffer_end_ = NULL;
    return false;
  }
}